

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nbt_parsing.c
# Opt level: O3

nbt_node * parse_unnamed_tag(nbt_type type,char *name,char **memory,size_t *length)

{
  size_t sVar1;
  undefined1 uVar2;
  byte bVar3;
  ushort uVar4;
  int8_t *piVar5;
  list_head *plVar6;
  ushort *puVar7;
  byte *pbVar8;
  nbt_node *__ptr;
  undefined1 *puVar9;
  nbt_list *pnVar10;
  char *name_00;
  undefined8 *puVar11;
  nbt_node *pnVar12;
  size_t sVar13;
  int *piVar14;
  long lVar15;
  char **ppcVar16;
  int32_t *piVar17;
  int64_t *piVar18;
  nbt_type nVar19;
  undefined1 *puVar20;
  char **ppcVar21;
  nbt_type type_00;
  undefined1 *puVar22;
  int iVar23;
  ulong __size;
  ulong uVar24;
  list_head *plVar25;
  bool bVar26;
  undefined8 local_48;
  undefined4 local_40;
  int local_34;
  
  __ptr = (nbt_node *)malloc(0x20);
  if (__ptr == (nbt_node *)0x0) {
    piVar14 = __errno_location();
    *piVar14 = -2;
    goto switchD_0010204b_default;
  }
  __ptr->type = type;
  __ptr->name = name;
  iVar23 = type - TAG_BYTE;
  ppcVar21 = memory;
  switch(iVar23) {
  case 0:
    sVar13 = *length;
    if (sVar13 == 0) goto switchD_0010204b_default;
    piVar5 = *memory;
    (__ptr->payload).tag_byte = *piVar5;
    *memory = piVar5 + 1;
    sVar13 = sVar13 - 1;
    goto LAB_00102398;
  case 1:
    uVar24 = *length;
    if (uVar24 < 2) goto switchD_0010204b_default;
    puVar7 = (ushort *)*memory;
    uVar4 = *puVar7;
    (__ptr->payload).tag_short = uVar4 << 8 | uVar4 >> 8;
    *memory = (char *)(puVar7 + 1);
    sVar13 = uVar24 - 2;
    goto LAB_00102398;
  case 2:
    uVar24 = *length;
    if (uVar24 < 4) goto switchD_0010204b_default;
    piVar17 = (int32_t *)*memory;
    (__ptr->payload).tag_int = *piVar17;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 3);
    lVar15 = -2;
    do {
      uVar2 = *(undefined1 *)((long)&__ptr->payload + lVar15 + 2);
      *(undefined1 *)((long)&__ptr->payload + lVar15 + 2) = *puVar9;
      *puVar9 = uVar2;
      puVar9 = puVar9 + -1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0);
    goto LAB_001022c5;
  case 3:
    uVar24 = *length;
    if (uVar24 < 8) goto switchD_0010204b_default;
    piVar18 = (int64_t *)*memory;
    (__ptr->payload).tag_long = *piVar18;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 7);
    lVar15 = 0;
    do {
      uVar2 = *(undefined1 *)((long)&__ptr->payload + lVar15);
      *(undefined1 *)((long)&__ptr->payload + lVar15) = *puVar9;
      *puVar9 = uVar2;
      puVar9 = puVar9 + -1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
    goto LAB_0010238c;
  case 4:
    uVar24 = *length;
    if (uVar24 < 4) goto switchD_0010204b_default;
    piVar17 = (int32_t *)*memory;
    (__ptr->payload).tag_int = *piVar17;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 3);
    lVar15 = -2;
    do {
      uVar2 = *(undefined1 *)((long)&__ptr->payload + lVar15 + 2);
      *(undefined1 *)((long)&__ptr->payload + lVar15 + 2) = *puVar9;
      *puVar9 = uVar2;
      puVar9 = puVar9 + -1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 0);
LAB_001022c5:
    *memory = (char *)(piVar17 + 1);
    sVar13 = uVar24 - 4;
    goto LAB_00102398;
  case 5:
    uVar24 = *length;
    if (uVar24 < 8) goto switchD_0010204b_default;
    piVar18 = (int64_t *)*memory;
    (__ptr->payload).tag_long = *piVar18;
    puVar9 = (undefined1 *)((long)&__ptr->payload + 7);
    lVar15 = 0;
    do {
      uVar2 = *(undefined1 *)((long)&__ptr->payload + lVar15);
      *(undefined1 *)((long)&__ptr->payload + lVar15) = *puVar9;
      *puVar9 = uVar2;
      puVar9 = puVar9 + -1;
      lVar15 = lVar15 + 1;
    } while (lVar15 != 4);
LAB_0010238c:
    *memory = (char *)(piVar18 + 1);
    sVar13 = uVar24 - 8;
LAB_00102398:
    *length = sVar13;
    break;
  case 6:
    local_48 = (nbt_list *)0x0;
    uVar24 = *length;
    if (uVar24 < 4) {
LAB_001026ec:
      piVar14 = __errno_location();
      if (*piVar14 == 0) {
        *piVar14 = -1;
      }
      free(local_48);
      pnVar10 = (nbt_list *)0x0;
    }
    else {
      piVar14 = (int *)*memory;
      puVar9 = (undefined1 *)((long)&local_40 + 3);
      local_40 = *piVar14;
      lVar15 = 8;
      do {
        uVar2 = *(undefined1 *)((long)&local_48 + lVar15);
        *(undefined1 *)((long)&local_48 + lVar15) = *puVar9;
        iVar23 = local_40;
        *puVar9 = uVar2;
        lVar15 = lVar15 + 1;
        puVar9 = puVar9 + -1;
      } while (lVar15 != 10);
      piVar14 = piVar14 + 1;
      *memory = (char *)piVar14;
      uVar24 = uVar24 - 4;
      *length = uVar24;
      __size = (ulong)local_40;
      if ((long)__size < 0) goto LAB_001026ec;
      pnVar10 = (nbt_list *)malloc(__size);
      local_48 = pnVar10;
      if (pnVar10 == (nbt_list *)0x0) {
        piVar14 = __errno_location();
        *piVar14 = -2;
        goto LAB_001026ec;
      }
      if (uVar24 < __size) goto LAB_001026ec;
      memcpy(pnVar10,piVar14,__size);
      *memory = (char *)((long)piVar14 + __size);
      *length = uVar24 - __size;
    }
    (__ptr->payload).tag_byte_array.data = (uchar *)pnVar10;
    (__ptr->payload).tag_byte_array.length = iVar23;
    break;
  case 7:
    pnVar10 = (nbt_list *)read_string(memory,length);
    goto LAB_00102752;
  case 8:
    pnVar10 = (nbt_list *)malloc(0x18);
    if (pnVar10 == (nbt_list *)0x0) {
LAB_00102671:
      piVar14 = __errno_location();
      *piVar14 = -2;
LAB_0010267c:
      piVar14 = __errno_location();
      if (*piVar14 == 0) {
        *piVar14 = -1;
      }
      nbt_free_list(pnVar10);
      pnVar10 = (nbt_list *)0x0;
    }
    else {
      pnVar12 = (nbt_node *)malloc(0x20);
      pnVar10->data = pnVar12;
      if (pnVar12 == (nbt_node *)0x0) goto LAB_00102671;
      plVar25 = &pnVar10->entry;
      (pnVar10->entry).blink = plVar25;
      (pnVar10->entry).flink = plVar25;
      uVar24 = *length;
      if (uVar24 == 0) goto LAB_0010267c;
      pbVar8 = (byte *)*memory;
      type_00 = (nbt_type)*pbVar8;
      *memory = (char *)(pbVar8 + 1);
      *length = uVar24 - 1;
      if (uVar24 < 5) goto LAB_0010267c;
      puVar9 = (undefined1 *)((long)&local_48 + 3);
      local_48 = (nbt_list *)CONCAT44(local_48._4_4_,*(undefined4 *)(pbVar8 + 1));
      lVar15 = 0;
      do {
        uVar2 = *(undefined1 *)((long)&local_48 + lVar15);
        *(undefined1 *)((long)&local_48 + lVar15) = *puVar9;
        *puVar9 = uVar2;
        lVar15 = lVar15 + 1;
        puVar9 = puVar9 + -1;
      } while (lVar15 != 2);
      *memory = (char *)(pbVar8 + 5);
      nVar19 = TAG_COMPOUND;
      if (type_00 != TAG_INVALID) {
        nVar19 = type_00;
      }
      *length = uVar24 - 5;
      pnVar12->type = nVar19;
      if (0 < (int)local_48) {
        iVar23 = 0;
        local_34 = (int)local_48;
        do {
          puVar11 = (undefined8 *)malloc(0x18);
          if (puVar11 == (undefined8 *)0x0) goto LAB_00102671;
          pnVar12 = parse_unnamed_tag(type_00,(char *)0x0,memory,length);
          *puVar11 = pnVar12;
          if (pnVar12 == (nbt_node *)0x0) {
            free(puVar11);
            goto LAB_0010267c;
          }
          puVar11[2] = plVar25;
          plVar6 = plVar25->blink;
          puVar11[1] = plVar6;
          plVar25->blink = (list_head *)(puVar11 + 1);
          plVar6->flink = (list_head *)(puVar11 + 1);
          iVar23 = iVar23 + 1;
        } while (iVar23 < local_34);
      }
    }
    (__ptr->payload).tag_list = pnVar10;
    break;
  case 9:
    pnVar10 = (nbt_list *)malloc(0x18);
    if (pnVar10 == (nbt_list *)0x0) {
      piVar14 = __errno_location();
      *piVar14 = -2;
    }
    else {
      pnVar10->data = (nbt_node *)0x0;
      plVar25 = &pnVar10->entry;
      (pnVar10->entry).blink = plVar25;
      (pnVar10->entry).flink = plVar25;
      while (sVar13 = *length, sVar13 != 0) {
        bVar3 = **memory;
        *memory = *memory + 1;
        *length = sVar13 - 1;
        if (bVar3 == 0) goto LAB_00102752;
        name_00 = read_string(memory,length);
        if (name_00 == (char *)0x0) break;
        puVar11 = (undefined8 *)malloc(0x18);
        if (puVar11 == (undefined8 *)0x0) {
          piVar14 = __errno_location();
          *piVar14 = -2;
LAB_0010272e:
          free(name_00);
          break;
        }
        pnVar12 = parse_unnamed_tag((uint)bVar3,name_00,memory,length);
        *puVar11 = pnVar12;
        if (pnVar12 == (nbt_node *)0x0) {
          free(puVar11);
          goto LAB_0010272e;
        }
        puVar11[2] = plVar25;
        plVar6 = plVar25->blink;
        puVar11[1] = plVar6;
        plVar25->blink = (list_head *)(puVar11 + 1);
        plVar6->flink = (list_head *)(puVar11 + 1);
      }
    }
    piVar14 = __errno_location();
    if (*piVar14 == 0) {
      *piVar14 = -1;
    }
    nbt_free_list(pnVar10);
    pnVar10 = (nbt_list *)0x0;
LAB_00102752:
    (__ptr->payload).tag_long = (int64_t)pnVar10;
    break;
  case 10:
    local_48 = (nbt_list *)0x0;
    uVar24 = *length;
    if (uVar24 < 4) goto LAB_001026bb;
    piVar14 = (int *)*memory;
    puVar9 = (undefined1 *)((long)&local_40 + 3);
    local_40 = *piVar14;
    lVar15 = 8;
    do {
      uVar2 = *(undefined1 *)((long)&local_48 + lVar15);
      *(undefined1 *)((long)&local_48 + lVar15) = *puVar9;
      iVar23 = local_40;
      *puVar9 = uVar2;
      lVar15 = lVar15 + 1;
      puVar9 = puVar9 + -1;
    } while (lVar15 != 10);
    piVar14 = piVar14 + 1;
    *memory = (char *)piVar14;
    uVar24 = uVar24 - 4;
    *length = uVar24;
    ppcVar21 = (char **)(long)local_40;
    if ((long)ppcVar21 < 0) goto LAB_001026bb;
    sVar1 = (long)ppcVar21 * 4;
    pnVar10 = (nbt_list *)malloc(sVar1);
    local_48 = pnVar10;
    if (pnVar10 == (nbt_list *)0x0) {
LAB_001026b0:
      piVar14 = __errno_location();
      *piVar14 = -2;
      goto LAB_001026bb;
    }
    if (uVar24 < sVar1) goto LAB_001026bb;
    memcpy(pnVar10,piVar14,sVar1);
    *memory = (char *)(piVar14 + (long)ppcVar21);
    *length = uVar24 + (long)ppcVar21 * -4;
    if (iVar23 == 0) {
LAB_0010278c:
      iVar23 = 0;
    }
    else {
      puVar9 = (undefined1 *)((long)&pnVar10->data + 1);
      ppcVar16 = (char **)0x0;
      do {
        puVar20 = (undefined1 *)((long)&pnVar10->data + (long)ppcVar16 * 4 + 3);
        puVar22 = puVar9;
        do {
          uVar2 = puVar22[-1];
          puVar22[-1] = *puVar20;
          *puVar20 = uVar2;
          puVar20 = puVar20 + -1;
          bVar26 = puVar22 < puVar20;
          puVar22 = puVar22 + 1;
        } while (bVar26);
        ppcVar16 = (char **)((long)ppcVar16 + 1);
        puVar9 = puVar9 + 4;
      } while (ppcVar16 != ppcVar21);
    }
    goto LAB_001026d8;
  case 0xb:
    local_48 = (nbt_list *)0x0;
    uVar24 = *length;
    if (3 < uVar24) {
      piVar14 = (int *)*memory;
      puVar9 = (undefined1 *)((long)&local_40 + 3);
      local_40 = *piVar14;
      lVar15 = 8;
      do {
        uVar2 = *(undefined1 *)((long)&local_48 + lVar15);
        *(undefined1 *)((long)&local_48 + lVar15) = *puVar9;
        iVar23 = local_40;
        *puVar9 = uVar2;
        lVar15 = lVar15 + 1;
        puVar9 = puVar9 + -1;
      } while (lVar15 != 10);
      piVar14 = piVar14 + 1;
      *memory = (char *)piVar14;
      uVar24 = uVar24 - 4;
      *length = uVar24;
      ppcVar21 = (char **)(long)local_40;
      if (-1 < (long)ppcVar21) {
        sVar1 = (long)ppcVar21 * 8;
        pnVar10 = (nbt_list *)malloc(sVar1);
        local_48 = pnVar10;
        if (pnVar10 == (nbt_list *)0x0) goto LAB_001026b0;
        if (sVar1 <= uVar24) {
          memcpy(pnVar10,piVar14,sVar1);
          *memory = (char *)(piVar14 + (long)ppcVar21 * 2);
          *length = uVar24 + (long)ppcVar21 * -8;
          if (iVar23 == 0) goto LAB_0010278c;
          puVar9 = (undefined1 *)((long)&pnVar10->data + 1);
          ppcVar16 = (char **)0x0;
          do {
            puVar20 = (undefined1 *)((long)&pnVar10->data + (long)ppcVar16 * 8 + 7);
            puVar22 = puVar9;
            do {
              uVar2 = puVar22[-1];
              puVar22[-1] = *puVar20;
              *puVar20 = uVar2;
              puVar20 = puVar20 + -1;
              bVar26 = puVar22 < puVar20;
              puVar22 = puVar22 + 1;
            } while (bVar26);
            ppcVar16 = (char **)((long)ppcVar16 + 1);
            puVar9 = puVar9 + 8;
          } while (ppcVar16 != ppcVar21);
          goto LAB_001026d8;
        }
      }
    }
LAB_001026bb:
    iVar23 = (int)ppcVar21;
    piVar14 = __errno_location();
    if (*piVar14 == 0) {
      *piVar14 = -1;
    }
    free(local_48);
    pnVar10 = (nbt_list *)0x0;
LAB_001026d8:
    (__ptr->payload).tag_list = pnVar10;
    (__ptr->payload).tag_byte_array.length = iVar23;
    break;
  default:
    goto switchD_0010204b_default;
  }
  piVar14 = __errno_location();
  if (*piVar14 == 0) {
    return __ptr;
  }
switchD_0010204b_default:
  piVar14 = __errno_location();
  if (*piVar14 == 0) {
    *piVar14 = -1;
  }
  free(__ptr);
  return (nbt_node *)0x0;
}

Assistant:

static nbt_node* parse_unnamed_tag(nbt_type type, char* name, const char** memory, size_t* length)
{
    nbt_node* node;

    CHECKED_MALLOC(node, sizeof *node, goto parse_error);

    node->type = type;
    node->name = name;

#define COPY_INTO_PAYLOAD(payload_name) \
    READ_GENERIC(&node->payload.payload_name, sizeof node->payload.payload_name, swapped_memscan, goto parse_error);

    switch(type)
    {
    case TAG_BYTE:
        COPY_INTO_PAYLOAD(tag_byte);
        break;
    case TAG_SHORT:
        COPY_INTO_PAYLOAD(tag_short);
        break;
    case TAG_INT:
        COPY_INTO_PAYLOAD(tag_int);
        break;
    case TAG_LONG:
        COPY_INTO_PAYLOAD(tag_long);
        break;
    case TAG_FLOAT:
        COPY_INTO_PAYLOAD(tag_float);
        break;
    case TAG_DOUBLE:
        COPY_INTO_PAYLOAD(tag_double);
        break;
    case TAG_BYTE_ARRAY:
        node->payload.tag_byte_array = read_byte_array(memory, length);
        break;
    case TAG_INT_ARRAY:
        node->payload.tag_int_array = read_int_array(memory, length);
        break;
    case TAG_LONG_ARRAY:
        node->payload.tag_long_array = read_long_array(memory, length);
        break;
    case TAG_STRING:
        node->payload.tag_string = read_string(memory, length);
        break;
    case TAG_LIST:
        node->payload.tag_list = read_list(memory, length);
        break;
    case TAG_COMPOUND:
        node->payload.tag_compound = read_compound(memory, length);
        break;

    default:
        goto parse_error; /* Unknown node or TAG_END. Either way, we shouldn't be parsing this. */
    }

#undef COPY_INTO_PAYLOAD

    if(errno != NBT_OK) goto parse_error;

    return node;

parse_error:
    if(errno == NBT_OK)
        errno = NBT_ERR;

    free(node);
    return NULL;
}